

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O0

bool tinyusdz::is_valid_utf8_identifier(string *str)

{
  bool bVar1;
  reference pvVar2;
  size_type sVar3;
  ulong local_40;
  size_t i;
  undefined1 local_30 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> codepoints;
  string *str_local;
  
  codepoints.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)str;
  to_codepoints((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,str);
  bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30);
  if (bVar1) {
    str_local._7_1_ = false;
  }
  else {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,0);
    if (*pvVar2 != 0x5f) {
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,0);
      bVar1 = unicode_xid::is_xid_start(*pvVar2);
      if (!bVar1) {
        str_local._7_1_ = false;
        goto LAB_001aef86;
      }
    }
    local_40 = 1;
    while( true ) {
      sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30);
      if (sVar3 <= local_40) break;
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,local_40);
      if (*pvVar2 != 0x5f) {
        pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,local_40
                           );
        bVar1 = unicode_xid::is_xid_continue(*pvVar2);
        if (!bVar1) {
          str_local._7_1_ = false;
          goto LAB_001aef86;
        }
      }
      local_40 = local_40 + 1;
    }
    str_local._7_1_ = true;
  }
LAB_001aef86:
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30);
  return str_local._7_1_;
}

Assistant:

bool is_valid_utf8_identifier(const std::string &str) {
  // First convert to codepoint values.
  std::vector<uint32_t> codepoints = to_codepoints(str);

  if (codepoints.empty()) {
    return false;
  }

  // (XID_Start|_) (XID_Continue|_)+
  
  if ((codepoints[0] != '_') && !unicode_xid::is_xid_start(codepoints[0])) {
    return false;
  }

  for (size_t i = 1; i < codepoints.size(); i++) {
    if ((codepoints[i] != '_') && !unicode_xid::is_xid_continue(codepoints[i])) {
      return false;
    }
  }

  return true; 
}